

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O0

double __thiscall
sliding_puzzle::SlidingPuzzle::getInadmissibleHeuristicCost
          (SlidingPuzzle *this,SlidingPuzzleStatePtr *state,int hidx)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *this_00;
  reference pvVar7;
  reference pvVar8;
  int hidx_local;
  SlidingPuzzleStatePtr *state_local;
  SlidingPuzzle *this_local;
  
  if (this->num_inadmissible_heuristic_ + -1 < hidx) {
    this_00 = std::operator<<((ostream *)&std::cerr,"Heuristic index out of range...!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local = (SlidingPuzzle *)0xbff0000000000000;
  }
  else {
    pvVar7 = std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
             operator[](&this->heuristic_weight_,(long)hidx);
    pvVar8 = std::array<double,_3UL>::operator[](pvVar7,0);
    dVar1 = *pvVar8;
    iVar4 = calculateManhattanDistance(this,state);
    pvVar7 = std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
             operator[](&this->heuristic_weight_,(long)hidx);
    pvVar8 = std::array<double,_3UL>::operator[](pvVar7,1);
    dVar2 = *pvVar8;
    iVar5 = calculateLinearConflict(this,state);
    pvVar7 = std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
             operator[](&this->heuristic_weight_,(long)hidx);
    pvVar8 = std::array<double,_3UL>::operator[](pvVar7,2);
    dVar3 = *pvVar8;
    iVar6 = calculateHammingDistance(this,state);
    this_local = (SlidingPuzzle *)
                 (dVar3 * (double)iVar6 + dVar1 * (double)iVar4 + dVar2 * (double)iVar5);
  }
  return (double)this_local;
}

Assistant:

double SlidingPuzzle::getInadmissibleHeuristicCost(const SlidingPuzzleStatePtr &state,
                                                   int hidx)
{
  if (hidx > num_inadmissible_heuristic_-1)
  {
    std::cerr << "Heuristic index out of range...!" << std::endl;
    return -1.0;
  }
  
  return heuristic_weight_[hidx][0]*calculateManhattanDistance(state) +
         heuristic_weight_[hidx][1]*calculateLinearConflict(state) +
         heuristic_weight_[hidx][2]*calculateHammingDistance(state);
}